

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_enlarge_conforming(REF_CAVITY ref_cavity)

{
  int iVar1;
  REF_NODE pRVar2;
  bool bVar3;
  uint uVar4;
  REF_STATUS RVar5;
  undefined8 in_RAX;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  REF_BOOL manifold;
  REF_BOOL conforming;
  undefined8 local_38;
  
  pRVar2 = ref_cavity->ref_grid->node;
  iVar10 = ref_cavity->surf_node;
  if (iVar10 == -1) {
    iVar10 = ref_cavity->node;
  }
  if (pRVar2->ref_mpi->id == pRVar2->part[iVar10]) {
    local_38 = in_RAX;
    if (ref_cavity->debug != 0) {
      printf(" conforming start %d tris %d segs\n",(ulong)(uint)ref_cavity->tri_list->n,
             (ulong)(uint)ref_cavity->nseg);
    }
    if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
      return 0;
    }
    if ((((ref_cavity->nseg == 0) && (ref_cavity->nface == 0)) && (ref_cavity->tri_list->n == 0)) &&
       (ref_cavity->tet_list->n == 0)) {
      ref_cavity->state = REF_CAVITY_NOOP;
      return 0;
    }
    uVar4 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (uVar4 == 0) {
      uVar6 = (ulong)(uint)ref_cavity->maxseg;
      while (0 < (int)uVar6) {
        lVar9 = 0;
        lVar11 = 4;
        bVar3 = false;
        do {
          iVar1 = *(int *)((long)ref_cavity->s2n + lVar11 + -4);
          if ((iVar10 != iVar1 && iVar1 != -1) &&
             (iVar10 != *(int *)((long)ref_cavity->s2n + lVar11))) {
            uVar4 = ref_cavity_conforming
                              (ref_cavity,(REF_INT)lVar9,(REF_BOOL *)((long)&local_38 + 4));
            if (uVar4 != 0) {
              pcVar8 = "free";
              uVar7 = 0x736;
              goto LAB_0018b96b;
            }
            if (local_38._4_4_ == 0) {
              uVar4 = ref_cavity_enlarge_seg(ref_cavity,(REF_INT)lVar9);
              if (uVar4 != 0) {
                pcVar8 = "enlarge seg";
                uVar7 = 0x738;
                uVar6 = (ulong)uVar4;
                goto LAB_0018b9a2;
              }
              bVar3 = true;
              if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
                if (ref_cavity->debug == 0) {
                  return 0;
                }
                uVar4 = ref_cavity_tec(ref_cavity,"enlarge.tec");
                if (uVar4 == 0) {
                  return 0;
                }
                pcVar8 = "tec for enlarge_seg fail";
                uVar7 = 0x73c;
                goto LAB_0018b96b;
              }
            }
          }
          lVar9 = lVar9 + 1;
          uVar6 = (ulong)ref_cavity->maxseg;
          lVar11 = lVar11 + 0xc;
        } while (lVar9 < (long)uVar6);
        if (!bVar3) break;
      }
      if (ref_cavity->debug != 0) {
        printf(" conforming final %d tris %d segs\n",(ulong)(uint)ref_cavity->tri_list->n,
               (ulong)(uint)ref_cavity->nseg);
      }
      uVar4 = ref_cavity_manifold(ref_cavity,(REF_BOOL *)&local_38);
      if (uVar4 == 0) {
        if ((int)local_38 == 0) {
          if (ref_cavity->debug != 0) {
            puts(" conforming not manifold");
          }
          ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
          return 0;
        }
        ref_cavity->state = REF_CAVITY_VISIBLE;
        RVar5 = ref_cavity_verify_seg_manifold(ref_cavity);
        if (RVar5 == 0) {
          return 0;
        }
        pcVar8 = "final seg manifold";
        uVar4 = 1;
        uVar7 = 0x753;
        uVar6 = 1;
LAB_0018b9a2:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar7,"ref_cavity_enlarge_conforming",uVar6,pcVar8);
        return uVar4;
      }
      pcVar8 = "manifold";
      uVar7 = 0x74a;
LAB_0018b96b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar7,"ref_cavity_enlarge_conforming",(ulong)uVar4,pcVar8);
      return uVar4;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x72b,
           "ref_cavity_enlarge_conforming",(ulong)uVar4,"initial seg manifold");
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x71b,
           "ref_cavity_enlarge_conforming","cavity part must own node");
  }
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_conforming(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node;
  REF_INT seg;
  REF_BOOL conforming, manifold;
  REF_BOOL keep_growing;

  node = ref_cavity_seg_node(ref_cavity);

  RAS(ref_node_owned(ref_node, node), "cavity part must own node");

  if (ref_cavity_debug(ref_cavity))
    printf(" conforming start %d tris %d segs\n",
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  if (0 == ref_cavity_nseg(ref_cavity) && 0 == ref_cavity_nface(ref_cavity) &&
      0 == ref_list_n(ref_cavity_tri_list(ref_cavity)) &&
      0 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_NOOP;
    return REF_SUCCESS;
  }

  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "initial seg manifold");

  keep_growing = REF_TRUE;
  while (keep_growing) {
    keep_growing = REF_FALSE;
    each_ref_cavity_valid_seg(ref_cavity, seg) {
      /* skip a seg attached to node */
      if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
          node == ref_cavity_s2n(ref_cavity, 1, seg))
        continue;

      RSS(ref_cavity_conforming(ref_cavity, seg, &conforming), "free");
      if (!conforming) {
        RSS(ref_cavity_enlarge_seg(ref_cavity, seg), "enlarge seg");
        if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) {
          if (ref_cavity_debug(ref_cavity)) {
            RSS(ref_cavity_tec(ref_cavity, "enlarge.tec"),
                "tec for enlarge_seg fail");
          }
          return REF_SUCCESS;
        }
        keep_growing = REF_TRUE;
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf(" conforming final %d tris %d segs\n",
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  RSS(ref_cavity_manifold(ref_cavity, &manifold), "manifold");
  if (!manifold) {
    if (ref_cavity_debug(ref_cavity)) printf(" conforming not manifold\n");
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity_state(ref_cavity) = REF_CAVITY_VISIBLE;

  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "final seg manifold");

  return REF_SUCCESS;
}